

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined4 uVar31;
  uint uVar32;
  uint uVar33;
  byte bVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong *puVar38;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong unaff_R12;
  size_t mask;
  ulong uVar47;
  long lVar48;
  long lVar49;
  bool bVar50;
  bool bVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float fVar55;
  float fVar64;
  undefined1 auVar56 [16];
  float fVar62;
  float fVar63;
  float fVar65;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar66;
  float fVar77;
  undefined1 auVar67 [16];
  float fVar75;
  float fVar76;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  __m128 a;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  uint uVar92;
  uint uVar93;
  uint uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined8 local_1690;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 *local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong *local_1620;
  ulong *local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  long local_15c8;
  RTCFilterFunctionNArguments local_15c0;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined4 local_1470;
  undefined4 uStack_146c;
  undefined4 uStack_1468;
  undefined4 uStack_1464;
  undefined4 local_1460;
  undefined4 uStack_145c;
  undefined4 uStack_1458;
  undefined4 uStack_1454;
  undefined4 local_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1448;
  undefined4 uStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  undefined1 local_1430 [16];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined1 local_1410 [16];
  uint local_1400;
  uint uStack_13fc;
  uint uStack_13f8;
  uint uStack_13f4;
  uint uStack_13f0;
  uint uStack_13ec;
  uint uStack_13e8;
  uint uStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1340 [32];
  float local_1320 [4];
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  float local_1300 [4];
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [8];
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined1 local_1240 [32];
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar113 = ZEXT3264(CONCAT428(fVar80,CONCAT424(fVar80,CONCAT420(fVar80,CONCAT416(fVar80,CONCAT412(
                                                  fVar80,CONCAT48(fVar80,CONCAT44(fVar80,fVar80)))))
                                                )));
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_14a0._4_4_ = fVar66;
  local_14a0._0_4_ = fVar66;
  local_14a0._8_4_ = fVar66;
  local_14a0._12_4_ = fVar66;
  local_14a0._16_4_ = fVar66;
  local_14a0._20_4_ = fVar66;
  local_14a0._24_4_ = fVar66;
  local_14a0._28_4_ = fVar66;
  auVar90 = ZEXT3264(local_14a0);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14c0._4_4_ = fVar95;
  local_14c0._0_4_ = fVar95;
  local_14c0._8_4_ = fVar95;
  local_14c0._12_4_ = fVar95;
  local_14c0._16_4_ = fVar95;
  local_14c0._20_4_ = fVar95;
  local_14c0._24_4_ = fVar95;
  local_14c0._28_4_ = fVar95;
  auVar91 = ZEXT3264(local_14c0);
  fVar80 = fVar80 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar66 = fVar66 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar95 = fVar95 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar45 = uVar41 ^ 0x20;
  uVar46 = uVar43 ^ 0x20;
  uVar37 = uVar44 ^ 0x20;
  local_14e0._0_8_ = CONCAT44(fVar80,fVar80) ^ 0x8000000080000000;
  local_14e0._8_4_ = -fVar80;
  local_14e0._12_4_ = -fVar80;
  local_14e0._16_4_ = -fVar80;
  local_14e0._20_4_ = -fVar80;
  local_14e0._24_4_ = -fVar80;
  local_14e0._28_4_ = -fVar80;
  auVar100 = ZEXT3264(local_14e0);
  local_1500._0_8_ = CONCAT44(fVar66,fVar66) ^ 0x8000000080000000;
  local_1500._8_4_ = -fVar66;
  local_1500._12_4_ = -fVar66;
  local_1500._16_4_ = -fVar66;
  local_1500._20_4_ = -fVar66;
  local_1500._24_4_ = -fVar66;
  local_1500._28_4_ = -fVar66;
  auVar103 = ZEXT3264(local_1500);
  local_1220 = 0x80000000;
  uStack_121c = 0x80000000;
  uStack_1218 = 0x80000000;
  uStack_1214 = 0x80000000;
  uStack_1210 = 0x80000000;
  uStack_120c = 0x80000000;
  uStack_1208 = 0x80000000;
  uStack_1204 = 0x80000000;
  local_1520._0_8_ = CONCAT44(fVar95,fVar95) ^ 0x8000000080000000;
  local_1520._8_4_ = -fVar95;
  local_1520._12_4_ = -fVar95;
  local_1520._16_4_ = -fVar95;
  local_1520._20_4_ = -fVar95;
  local_1520._24_4_ = -fVar95;
  local_1520._28_4_ = -fVar95;
  auVar106 = ZEXT3264(local_1520);
  iVar1 = (tray->tnear).field_0.i[k];
  local_1540._4_4_ = iVar1;
  local_1540._0_4_ = iVar1;
  local_1540._8_4_ = iVar1;
  local_1540._12_4_ = iVar1;
  local_1540._16_4_ = iVar1;
  local_1540._20_4_ = iVar1;
  local_1540._24_4_ = iVar1;
  local_1540._28_4_ = iVar1;
  auVar109 = ZEXT3264(local_1540);
  iVar1 = (tray->tfar).field_0.i[k];
  local_1560._4_4_ = iVar1;
  local_1560._0_4_ = iVar1;
  local_1560._8_4_ = iVar1;
  local_1560._12_4_ = iVar1;
  local_1560._16_4_ = iVar1;
  local_1560._20_4_ = iVar1;
  local_1560._24_4_ = iVar1;
  local_1560._28_4_ = iVar1;
  auVar112 = ZEXT3264(local_1560);
  local_15e8 = uVar41 >> 2;
  local_1240._16_16_ = mm_lookupmask_ps._240_16_;
  local_1240._0_16_ = mm_lookupmask_ps._0_16_;
  local_1660 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_15f0 = uVar45 >> 2;
  local_15f8 = uVar43 >> 2;
  local_1600 = uVar46 >> 2;
  local_1608 = uVar44 >> 2;
  local_1610 = uVar37 >> 2;
  auVar84._8_4_ = 0xbf800000;
  auVar84._0_8_ = 0xbf800000bf800000;
  auVar84._12_4_ = 0xbf800000;
  auVar84._16_4_ = 0xbf800000;
  auVar84._20_4_ = 0xbf800000;
  auVar84._24_4_ = 0xbf800000;
  auVar84._28_4_ = 0xbf800000;
  auVar68._8_4_ = 0x3f800000;
  auVar68._0_8_ = &DAT_3f8000003f800000;
  auVar68._12_4_ = 0x3f800000;
  auVar68._16_4_ = 0x3f800000;
  auVar68._20_4_ = 0x3f800000;
  auVar68._24_4_ = 0x3f800000;
  auVar68._28_4_ = 0x3f800000;
  _local_1260 = vblendvps_avx(auVar68,auVar84,local_1240);
  puVar38 = local_11f8;
  local_1658 = uVar37;
  local_1650 = uVar46;
  local_1648 = uVar45;
  local_1640 = uVar44;
  local_1638 = uVar43;
  local_1630 = uVar41;
  do {
    local_1620 = puVar38;
    if (puVar38 == &local_1200) break;
    local_1618 = puVar38 + -1;
    local_15e0 = puVar38[-1];
    local_1628 = unaff_R12;
    do {
      if ((local_15e0 & 8) == 0) {
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar41),auVar100._0_32_
                                  ,auVar113._0_32_);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar43),auVar103._0_32_
                                  ,auVar90._0_32_);
        auVar84 = vpmaxsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar17));
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar44),auVar106._0_32_
                                  ,auVar91._0_32_);
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar45),auVar100._0_32_
                                  ,auVar113._0_32_);
        auVar18 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar46),auVar103._0_32_
                                  ,auVar90._0_32_);
        auVar57 = vpminsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar18));
        auVar17 = vfmadd132ps_fma(*(undefined1 (*) [32])(local_15e0 + 0x40 + uVar37),auVar106._0_32_
                                  ,auVar91._0_32_);
        auVar68 = vpmaxsd_avx2(ZEXT1632(auVar16),auVar109._0_32_);
        auVar84 = vpmaxsd_avx2(auVar84,auVar68);
        auVar68 = vpminsd_avx2(ZEXT1632(auVar17),auVar112._0_32_);
        auVar68 = vpminsd_avx2(auVar57,auVar68);
        auVar84 = vpcmpgtd_avx2(auVar84,auVar68);
        uVar31 = vmovmskps_avx(auVar84);
        local_1628 = (ulong)(byte)~(byte)uVar31;
      }
      if ((local_15e0 & 8) == 0) {
        if (local_1628 == 0) {
          uVar32 = 4;
        }
        else {
          uVar47 = local_15e0 & 0xfffffffffffffff0;
          lVar36 = 0;
          for (uVar35 = local_1628; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar36 = lVar36 + 1;
          }
          uVar32 = 0;
          for (uVar35 = local_1628 - 1 & local_1628; local_15e0 = *(ulong *)(uVar47 + lVar36 * 8),
              uVar35 != 0; uVar35 = uVar35 - 1 & uVar35) {
            *local_1618 = local_15e0;
            local_1618 = local_1618 + 1;
            lVar36 = 0;
            for (uVar15 = uVar35; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar36 = lVar36 + 1;
            }
          }
        }
      }
      else {
        uVar32 = 6;
      }
    } while (uVar32 == 0);
    if (uVar32 == 6) {
      local_15d8 = (ulong)((uint)local_15e0 & 0xf) - 8;
      bVar50 = local_15d8 != 0;
      if (bVar50) {
        local_15e0 = local_15e0 & 0xfffffffffffffff0;
        local_15d0 = 0;
        do {
          lVar36 = local_15d0 * 0x90;
          local_15c8 = lVar36 + local_15e0;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(local_15e0 + 0x40 + lVar36);
          auVar18 = vpmovzxbw_avx(auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(local_15e0 + 0x48 + lVar36);
          auVar16 = vpmovzxbw_avx(auVar17);
          auVar16 = vpminuw_avx(auVar18,auVar16);
          auVar16 = vpcmpeqw_avx(auVar18,auVar16);
          auVar16 = vpacksswb_avx(auVar16,auVar16);
          uVar31 = *(undefined4 *)(local_15e0 + 0x70 + lVar36);
          auVar57._4_4_ = uVar31;
          auVar57._0_4_ = uVar31;
          auVar57._8_4_ = uVar31;
          auVar57._12_4_ = uVar31;
          auVar57._16_4_ = uVar31;
          auVar57._20_4_ = uVar31;
          auVar57._24_4_ = uVar31;
          auVar57._28_4_ = uVar31;
          uVar31 = *(undefined4 *)(local_15e0 + 0x7c + lVar36);
          auVar69._4_4_ = uVar31;
          auVar69._0_4_ = uVar31;
          auVar69._8_4_ = uVar31;
          auVar69._12_4_ = uVar31;
          auVar69._16_4_ = uVar31;
          auVar69._20_4_ = uVar31;
          auVar69._24_4_ = uVar31;
          auVar69._28_4_ = uVar31;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(local_15e8 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar18);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar17 = vfmadd213ps_fma(auVar84,auVar69,auVar57);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_15f0 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar2);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar18 = vfmadd213ps_fma(auVar84,auVar69,auVar57);
          uVar31 = *(undefined4 *)(local_15e0 + 0x74 + lVar36);
          auVar58._4_4_ = uVar31;
          auVar58._0_4_ = uVar31;
          auVar58._8_4_ = uVar31;
          auVar58._12_4_ = uVar31;
          auVar58._16_4_ = uVar31;
          auVar58._20_4_ = uVar31;
          auVar58._24_4_ = uVar31;
          auVar58._28_4_ = uVar31;
          uVar31 = *(undefined4 *)(local_15e0 + 0x80 + lVar36);
          auVar70._4_4_ = uVar31;
          auVar70._0_4_ = uVar31;
          auVar70._8_4_ = uVar31;
          auVar70._12_4_ = uVar31;
          auVar70._16_4_ = uVar31;
          auVar70._20_4_ = uVar31;
          auVar70._24_4_ = uVar31;
          auVar70._28_4_ = uVar31;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_15f8 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar3);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar2 = vfmadd213ps_fma(auVar84,auVar70,auVar58);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_1600 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar4);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar3 = vfmadd213ps_fma(auVar84,auVar70,auVar58);
          uVar31 = *(undefined4 *)(local_15e0 + 0x78 + lVar36);
          auVar59._4_4_ = uVar31;
          auVar59._0_4_ = uVar31;
          auVar59._8_4_ = uVar31;
          auVar59._12_4_ = uVar31;
          auVar59._16_4_ = uVar31;
          auVar59._20_4_ = uVar31;
          auVar59._24_4_ = uVar31;
          auVar59._28_4_ = uVar31;
          uVar31 = *(undefined4 *)(local_15e0 + 0x84 + lVar36);
          auVar71._4_4_ = uVar31;
          auVar71._0_4_ = uVar31;
          auVar71._8_4_ = uVar31;
          auVar71._12_4_ = uVar31;
          auVar71._16_4_ = uVar31;
          auVar71._20_4_ = uVar31;
          auVar71._24_4_ = uVar31;
          auVar71._28_4_ = uVar31;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_1608 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar5);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar4 = vfmadd213ps_fma(auVar84,auVar71,auVar59);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_1610 + 0x40 + local_15c8);
          auVar84 = vpmovzxbd_avx2(auVar6);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar5 = vfmadd213ps_fma(auVar84,auVar71,auVar59);
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar113._0_32_,auVar100._0_32_);
          auVar2 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar90._0_32_,auVar103._0_32_);
          auVar84 = vpmaxsd_avx2(ZEXT1632(auVar17),ZEXT1632(auVar2));
          auVar17 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar91._0_32_,auVar106._0_32_);
          auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar113._0_32_,auVar100._0_32_);
          auVar2 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar90._0_32_,auVar103._0_32_);
          auVar57 = vpminsd_avx2(ZEXT1632(auVar18),ZEXT1632(auVar2));
          auVar18 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar91._0_32_,auVar106._0_32_);
          auVar68 = vpmaxsd_avx2(ZEXT1632(auVar17),auVar109._0_32_);
          auVar84 = vpmaxsd_avx2(auVar84,auVar68);
          auVar68 = vpminsd_avx2(ZEXT1632(auVar18),auVar112._0_32_);
          auVar68 = vpminsd_avx2(auVar57,auVar68);
          auVar84 = vpcmpgtd_avx2(auVar84,auVar68);
          uVar31 = vmovmskps_avx(auVar84);
          bVar34 = ~(byte)uVar31 &
                   (SUB161(auVar16 >> 7,0) & 1 | (SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                    (SUB161(auVar16 >> 0x17,0) & 1) << 2 | (SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                    (SUB161(auVar16 >> 0x27,0) & 1) << 4 | (SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                    (SUB161(auVar16 >> 0x37,0) & 1) << 6 | SUB161(auVar16 >> 0x3f,0) << 7);
          if (bVar34 != 0) {
            uVar37 = (ulong)bVar34;
            do {
              lVar36 = 0;
              for (uVar41 = uVar37; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                lVar36 = lVar36 + 1;
              }
              uVar7 = *(ushort *)(local_15c8 + lVar36 * 8);
              uVar8 = *(ushort *)(local_15c8 + 2 + lVar36 * 8);
              uVar32 = *(uint *)(local_15c8 + 0x88);
              uVar9 = *(uint *)(local_15c8 + 4 + lVar36 * 8);
              pGVar10 = (context->scene->geometries).items[uVar32].ptr;
              lVar36 = *(long *)&pGVar10->field_0x58;
              lVar39 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * (ulong)uVar9;
              uVar40 = uVar7 & 0x7fff;
              uVar42 = uVar8 & 0x7fff;
              uVar33 = *(uint *)(lVar36 + 4 + lVar39);
              uVar44 = (ulong)uVar33;
              uVar43 = (ulong)(uVar33 * uVar42 + *(int *)(lVar36 + lVar39) + uVar40);
              p_Var11 = pGVar10[1].intersectionFilterN;
              lVar12 = *(long *)&pGVar10[1].time_range.upper;
              auVar16 = *(undefined1 (*) [16])(lVar12 + (uVar43 + 1) * (long)p_Var11);
              auVar17 = *(undefined1 (*) [16])(lVar12 + (uVar43 + uVar44) * (long)p_Var11);
              lVar49 = uVar43 + uVar44 + 1;
              auVar18 = *(undefined1 (*) [16])(lVar12 + lVar49 * (long)p_Var11);
              auVar2 = *(undefined1 (*) [16])
                        (lVar12 + (uVar43 + (-1 < (short)uVar7) + 1) * (long)p_Var11);
              lVar48 = (ulong)(-1 < (short)uVar7) + lVar49;
              auVar3 = *(undefined1 (*) [16])(lVar12 + lVar48 * (long)p_Var11);
              uVar41 = 0;
              if (-1 < (short)uVar8) {
                uVar41 = uVar44;
              }
              auVar4 = *(undefined1 (*) [16])(lVar12 + (uVar43 + uVar44 + uVar41) * (long)p_Var11);
              auVar5 = *(undefined1 (*) [16])(lVar12 + (lVar49 + uVar41) * (long)p_Var11);
              auVar88._16_16_ = *(undefined1 (*) [16])(lVar12 + (uVar41 + lVar48) * (long)p_Var11);
              auVar88._0_16_ = auVar18;
              auVar81 = vunpcklps_avx(auVar16,auVar3);
              auVar6 = vunpckhps_avx(auVar16,auVar3);
              auVar85 = vunpcklps_avx(auVar2,auVar18);
              auVar2 = vunpckhps_avx(auVar2,auVar18);
              auVar13 = vunpcklps_avx(auVar6,auVar2);
              auVar14 = vunpcklps_avx(auVar81,auVar85);
              auVar2 = vunpckhps_avx(auVar81,auVar85);
              auVar81 = vunpcklps_avx(auVar17,auVar5);
              auVar6 = vunpckhps_avx(auVar17,auVar5);
              auVar85 = vunpcklps_avx(auVar18,auVar4);
              auVar4 = vunpckhps_avx(auVar18,auVar4);
              auVar6 = vunpcklps_avx(auVar6,auVar4);
              auVar67 = vunpcklps_avx(auVar81,auVar85);
              auVar4 = vunpckhps_avx(auVar81,auVar85);
              auVar72._16_16_ = auVar5;
              auVar72._0_16_ = auVar17;
              auVar60._16_16_ = auVar3;
              auVar60._0_16_ = auVar16;
              auVar84 = vunpcklps_avx(auVar60,auVar72);
              auVar52._16_16_ = auVar18;
              auVar52._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var11 * uVar43);
              auVar68 = vunpcklps_avx(auVar52,auVar88);
              auVar70 = vunpcklps_avx(auVar68,auVar84);
              auVar71 = vunpckhps_avx(auVar68,auVar84);
              auVar84 = vunpckhps_avx(auVar60,auVar72);
              auVar68 = vunpckhps_avx(auVar52,auVar88);
              auVar52 = vunpcklps_avx(auVar68,auVar84);
              auVar53._16_16_ = auVar14;
              auVar53._0_16_ = auVar14;
              auVar73._16_16_ = auVar2;
              auVar73._0_16_ = auVar2;
              auVar82._16_16_ = auVar13;
              auVar82._0_16_ = auVar13;
              auVar86._16_16_ = auVar67;
              auVar86._0_16_ = auVar67;
              auVar98._16_16_ = auVar4;
              auVar98._0_16_ = auVar4;
              auVar101._16_16_ = auVar6;
              auVar101._0_16_ = auVar6;
              auVar68 = vsubps_avx(auVar70,auVar53);
              auVar84 = vsubps_avx(auVar71,auVar73);
              auVar57 = vsubps_avx(auVar52,auVar82);
              auVar58 = vsubps_avx(auVar86,auVar70);
              auVar59 = vsubps_avx(auVar98,auVar71);
              auVar69 = vsubps_avx(auVar101,auVar52);
              auVar19._4_4_ = auVar84._4_4_ * auVar69._4_4_;
              auVar19._0_4_ = auVar84._0_4_ * auVar69._0_4_;
              auVar19._8_4_ = auVar84._8_4_ * auVar69._8_4_;
              auVar19._12_4_ = auVar84._12_4_ * auVar69._12_4_;
              auVar19._16_4_ = auVar84._16_4_ * auVar69._16_4_;
              auVar19._20_4_ = auVar84._20_4_ * auVar69._20_4_;
              auVar19._24_4_ = auVar84._24_4_ * auVar69._24_4_;
              auVar19._28_4_ = auVar14._12_4_;
              auVar3 = vfmsub231ps_fma(auVar19,auVar59,auVar57);
              uVar31 = *(undefined4 *)(ray + k * 4);
              auVar104._4_4_ = uVar31;
              auVar104._0_4_ = uVar31;
              auVar104._8_4_ = uVar31;
              auVar104._12_4_ = uVar31;
              auVar104._16_4_ = uVar31;
              auVar104._20_4_ = uVar31;
              auVar104._24_4_ = uVar31;
              auVar104._28_4_ = uVar31;
              uVar31 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar107._4_4_ = uVar31;
              auVar107._0_4_ = uVar31;
              auVar107._8_4_ = uVar31;
              auVar107._12_4_ = uVar31;
              auVar107._16_4_ = uVar31;
              auVar107._20_4_ = uVar31;
              auVar107._24_4_ = uVar31;
              auVar107._28_4_ = uVar31;
              uVar31 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar110._4_4_ = uVar31;
              auVar110._0_4_ = uVar31;
              auVar110._8_4_ = uVar31;
              auVar110._12_4_ = uVar31;
              auVar110._16_4_ = uVar31;
              auVar110._20_4_ = uVar31;
              auVar110._24_4_ = uVar31;
              auVar110._28_4_ = uVar31;
              fVar80 = *(float *)(ray + k * 4 + 0x40);
              auVar99._4_4_ = fVar80;
              auVar99._0_4_ = fVar80;
              auVar99._8_4_ = fVar80;
              auVar99._12_4_ = fVar80;
              auVar99._16_4_ = fVar80;
              auVar99._20_4_ = fVar80;
              auVar99._24_4_ = fVar80;
              auVar99._28_4_ = fVar80;
              auVar20._4_4_ = auVar57._4_4_ * auVar58._4_4_;
              auVar20._0_4_ = auVar57._0_4_ * auVar58._0_4_;
              auVar20._8_4_ = auVar57._8_4_ * auVar58._8_4_;
              auVar20._12_4_ = auVar57._12_4_ * auVar58._12_4_;
              auVar20._16_4_ = auVar57._16_4_ * auVar58._16_4_;
              auVar20._20_4_ = auVar57._20_4_ * auVar58._20_4_;
              auVar20._24_4_ = auVar57._24_4_ * auVar58._24_4_;
              auVar20._28_4_ = auVar2._12_4_;
              auVar70 = vsubps_avx(auVar70,auVar104);
              fVar66 = *(float *)(ray + k * 4 + 0x50);
              auVar105._4_4_ = fVar66;
              auVar105._0_4_ = fVar66;
              auVar105._8_4_ = fVar66;
              auVar105._12_4_ = fVar66;
              auVar105._16_4_ = fVar66;
              auVar105._20_4_ = fVar66;
              auVar105._24_4_ = fVar66;
              auVar105._28_4_ = fVar66;
              auVar2 = vfmsub231ps_fma(auVar20,auVar69,auVar68);
              auVar71 = vsubps_avx(auVar71,auVar107);
              fVar95 = *(float *)(ray + k * 4 + 0x60);
              auVar108._4_4_ = fVar95;
              auVar108._0_4_ = fVar95;
              auVar108._8_4_ = fVar95;
              auVar108._12_4_ = fVar95;
              auVar108._16_4_ = fVar95;
              auVar108._20_4_ = fVar95;
              auVar108._24_4_ = fVar95;
              auVar108._28_4_ = fVar95;
              auVar52 = vsubps_avx(auVar52,auVar110);
              auVar21._4_4_ = fVar80 * auVar71._4_4_;
              auVar21._0_4_ = fVar80 * auVar71._0_4_;
              auVar21._8_4_ = fVar80 * auVar71._8_4_;
              auVar21._12_4_ = fVar80 * auVar71._12_4_;
              auVar21._16_4_ = fVar80 * auVar71._16_4_;
              auVar21._20_4_ = fVar80 * auVar71._20_4_;
              auVar21._24_4_ = fVar80 * auVar71._24_4_;
              auVar21._28_4_ = uVar31;
              auVar16 = vfmsub231ps_fma(auVar21,auVar70,auVar105);
              auVar22._4_4_ = auVar69._4_4_ * auVar16._4_4_;
              auVar22._0_4_ = auVar69._0_4_ * auVar16._0_4_;
              auVar22._8_4_ = auVar69._8_4_ * auVar16._8_4_;
              auVar22._12_4_ = auVar69._12_4_ * auVar16._12_4_;
              auVar22._16_4_ = auVar69._16_4_ * 0.0;
              auVar22._20_4_ = auVar69._20_4_ * 0.0;
              auVar22._24_4_ = auVar69._24_4_ * 0.0;
              auVar22._28_4_ = auVar69._28_4_;
              auVar111._0_4_ = auVar57._0_4_ * auVar16._0_4_;
              auVar111._4_4_ = auVar57._4_4_ * auVar16._4_4_;
              auVar111._8_4_ = auVar57._8_4_ * auVar16._8_4_;
              auVar111._12_4_ = auVar57._12_4_ * auVar16._12_4_;
              auVar111._16_4_ = auVar57._16_4_ * 0.0;
              auVar111._20_4_ = auVar57._20_4_ * 0.0;
              auVar111._24_4_ = auVar57._24_4_ * 0.0;
              auVar111._28_4_ = 0;
              auVar23._4_4_ = fVar95 * auVar70._4_4_;
              auVar23._0_4_ = fVar95 * auVar70._0_4_;
              auVar23._8_4_ = fVar95 * auVar70._8_4_;
              auVar23._12_4_ = fVar95 * auVar70._12_4_;
              auVar23._16_4_ = fVar95 * auVar70._16_4_;
              auVar23._20_4_ = fVar95 * auVar70._20_4_;
              auVar23._24_4_ = fVar95 * auVar70._24_4_;
              auVar23._28_4_ = auVar57._28_4_;
              auVar17 = vfmsub231ps_fma(auVar23,auVar52,auVar99);
              auVar16 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar17),auVar59);
              auVar17 = vfmadd231ps_fma(auVar111,auVar84,ZEXT1632(auVar17));
              auVar24._4_4_ = auVar68._4_4_ * auVar59._4_4_;
              auVar24._0_4_ = auVar68._0_4_ * auVar59._0_4_;
              auVar24._8_4_ = auVar68._8_4_ * auVar59._8_4_;
              auVar24._12_4_ = auVar68._12_4_ * auVar59._12_4_;
              auVar24._16_4_ = auVar68._16_4_ * auVar59._16_4_;
              auVar24._20_4_ = auVar68._20_4_ * auVar59._20_4_;
              auVar24._24_4_ = auVar68._24_4_ * auVar59._24_4_;
              auVar24._28_4_ = auVar59._28_4_;
              auVar18 = vfmsub231ps_fma(auVar24,auVar58,auVar84);
              auVar25._4_4_ = fVar66 * auVar52._4_4_;
              auVar25._0_4_ = fVar66 * auVar52._0_4_;
              auVar25._8_4_ = fVar66 * auVar52._8_4_;
              auVar25._12_4_ = fVar66 * auVar52._12_4_;
              auVar25._16_4_ = fVar66 * auVar52._16_4_;
              auVar25._20_4_ = fVar66 * auVar52._20_4_;
              auVar25._24_4_ = fVar66 * auVar52._24_4_;
              auVar25._28_4_ = auVar84._28_4_;
              auVar4 = vfmsub231ps_fma(auVar25,auVar71,auVar108);
              fVar80 = auVar18._0_4_;
              fVar66 = auVar18._4_4_;
              auVar26._4_4_ = fVar95 * fVar66;
              auVar26._0_4_ = fVar95 * fVar80;
              fVar75 = auVar18._8_4_;
              auVar26._8_4_ = fVar95 * fVar75;
              fVar76 = auVar18._12_4_;
              auVar26._12_4_ = fVar95 * fVar76;
              auVar26._16_4_ = fVar95 * 0.0;
              auVar26._20_4_ = fVar95 * 0.0;
              auVar26._24_4_ = fVar95 * 0.0;
              auVar26._28_4_ = fVar95;
              auVar18 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar2),auVar105);
              auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar3),auVar99);
              auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar4),auVar58);
              auVar30._4_4_ = uStack_121c;
              auVar30._0_4_ = local_1220;
              auVar30._8_4_ = uStack_1218;
              auVar30._12_4_ = uStack_1214;
              auVar30._16_4_ = uStack_1210;
              auVar30._20_4_ = uStack_120c;
              auVar30._24_4_ = uStack_1208;
              auVar30._28_4_ = uStack_1204;
              auVar84 = vandps_avx(ZEXT1632(auVar18),auVar30);
              uVar33 = auVar84._0_4_;
              auVar87._0_4_ = (float)(uVar33 ^ auVar16._0_4_);
              uVar92 = auVar84._4_4_;
              auVar87._4_4_ = (float)(uVar92 ^ auVar16._4_4_);
              uVar93 = auVar84._8_4_;
              auVar87._8_4_ = (float)(uVar93 ^ auVar16._8_4_);
              uVar94 = auVar84._12_4_;
              auVar87._12_4_ = (float)(uVar94 ^ auVar16._12_4_);
              fVar95 = auVar84._16_4_;
              auVar87._16_4_ = fVar95;
              fVar96 = auVar84._20_4_;
              auVar87._20_4_ = fVar96;
              fVar97 = auVar84._24_4_;
              auVar87._24_4_ = fVar97;
              fVar77 = auVar84._28_4_;
              auVar87._28_4_ = fVar77;
              auVar16 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar68,ZEXT1632(auVar4));
              auVar89._0_4_ = (float)(uVar33 ^ auVar16._0_4_);
              auVar89._4_4_ = (float)(uVar92 ^ auVar16._4_4_);
              auVar89._8_4_ = (float)(uVar93 ^ auVar16._8_4_);
              auVar89._12_4_ = (float)(uVar94 ^ auVar16._12_4_);
              auVar89._16_4_ = fVar95;
              auVar89._20_4_ = fVar96;
              auVar89._24_4_ = fVar97;
              auVar89._28_4_ = fVar77;
              auVar84 = vcmpps_avx(auVar87,ZEXT832(0) << 0x20,5);
              auVar68 = vcmpps_avx(auVar89,ZEXT832(0) << 0x20,5);
              auVar84 = vandps_avx(auVar68,auVar84);
              auVar61._8_4_ = 0x7fffffff;
              auVar61._0_8_ = 0x7fffffff7fffffff;
              auVar61._12_4_ = 0x7fffffff;
              auVar61._16_4_ = 0x7fffffff;
              auVar61._20_4_ = 0x7fffffff;
              auVar61._24_4_ = 0x7fffffff;
              auVar61._28_4_ = 0x7fffffff;
              local_1380 = vandps_avx(ZEXT1632(auVar18),auVar61);
              auVar68 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
              auVar84 = vandps_avx(auVar84,auVar68);
              auVar102._0_4_ = auVar89._0_4_ + auVar87._0_4_;
              auVar102._4_4_ = auVar89._4_4_ + auVar87._4_4_;
              auVar102._8_4_ = auVar89._8_4_ + auVar87._8_4_;
              auVar102._12_4_ = auVar89._12_4_ + auVar87._12_4_;
              auVar102._16_4_ = fVar95 + fVar95;
              auVar102._20_4_ = fVar96 + fVar96;
              auVar102._24_4_ = fVar97 + fVar97;
              auVar102._28_4_ = fVar77 + fVar77;
              auVar68 = vcmpps_avx(auVar102,local_1380,2);
              auVar57 = auVar68 & auVar84;
              if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar57 >> 0x7f,0) != '\0') ||
                    (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar57 >> 0xbf,0) != '\0') ||
                  (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar57[0x1f] < '\0') {
                auVar84 = vandps_avx(auVar84,auVar68);
                auVar16 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
                auVar27._4_4_ = fVar66 * auVar52._4_4_;
                auVar27._0_4_ = fVar80 * auVar52._0_4_;
                auVar27._8_4_ = fVar75 * auVar52._8_4_;
                auVar27._12_4_ = fVar76 * auVar52._12_4_;
                auVar27._16_4_ = auVar52._16_4_ * 0.0;
                auVar27._20_4_ = auVar52._20_4_ * 0.0;
                auVar27._24_4_ = auVar52._24_4_ * 0.0;
                auVar27._28_4_ = auVar52._28_4_;
                auVar17 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar2),auVar27);
                auVar17 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar3),ZEXT1632(auVar17));
                local_13a0._0_4_ = (float)(uVar33 ^ auVar17._0_4_);
                local_13a0._4_4_ = (float)(uVar92 ^ auVar17._4_4_);
                local_13a0._8_4_ = (float)(uVar93 ^ auVar17._8_4_);
                local_13a0._12_4_ = (float)(uVar94 ^ auVar17._12_4_);
                local_13a0._16_4_ = fVar95;
                local_13a0._20_4_ = fVar96;
                local_13a0._24_4_ = fVar97;
                local_13a0._28_4_ = fVar77;
                fVar77 = *(float *)(ray + k * 4 + 0x30);
                fVar78 = local_1380._0_4_;
                fVar79 = local_1380._4_4_;
                auVar28._4_4_ = fVar79 * fVar77;
                auVar28._0_4_ = fVar78 * fVar77;
                fVar55 = local_1380._8_4_;
                auVar28._8_4_ = fVar55 * fVar77;
                fVar62 = local_1380._12_4_;
                auVar28._12_4_ = fVar62 * fVar77;
                fVar63 = local_1380._16_4_;
                auVar28._16_4_ = fVar63 * fVar77;
                fVar64 = local_1380._20_4_;
                auVar28._20_4_ = fVar64 * fVar77;
                fVar65 = local_1380._24_4_;
                auVar28._24_4_ = fVar65 * fVar77;
                auVar28._28_4_ = fVar77;
                auVar84 = vcmpps_avx(auVar28,local_13a0,1);
                fVar77 = *(float *)(ray + k * 4 + 0x80);
                auVar29._4_4_ = fVar79 * fVar77;
                auVar29._0_4_ = fVar78 * fVar77;
                auVar29._8_4_ = fVar55 * fVar77;
                auVar29._12_4_ = fVar62 * fVar77;
                auVar29._16_4_ = fVar63 * fVar77;
                auVar29._20_4_ = fVar64 * fVar77;
                auVar29._24_4_ = fVar65 * fVar77;
                auVar29._28_4_ = fVar77;
                auVar68 = vcmpps_avx(local_13a0,auVar29,2);
                auVar84 = vandps_avx(auVar84,auVar68);
                auVar17 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
                auVar16 = vpand_avx(auVar16,auVar17);
                auVar84 = vpmovzxwd_avx2(auVar16);
                auVar84 = vpslld_avx2(auVar84,0x1f);
                if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar84 >> 0x7f,0) != '\0') ||
                      (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar84 >> 0xbf,0) != '\0') ||
                    (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar84[0x1f] < '\0') {
                  local_1340 = vpsrad_avx2(auVar84,0x1f);
                  auVar84 = vsubps_avx(local_1380,auVar89);
                  auVar84 = vblendvps_avx(auVar87,auVar84,local_1240);
                  auVar68 = vsubps_avx(local_1380,auVar87);
                  auVar68 = vblendvps_avx(auVar89,auVar68,local_1240);
                  local_12c0._0_4_ = (float)local_1260._0_4_ * auVar3._0_4_;
                  local_12c0._4_4_ = (float)local_1260._4_4_ * auVar3._4_4_;
                  local_12c0._8_4_ = fStack_1258 * auVar3._8_4_;
                  local_12c0._12_4_ = fStack_1254 * auVar3._12_4_;
                  local_12c0._16_4_ = fStack_1250 * 0.0;
                  local_12c0._20_4_ = fStack_124c * 0.0;
                  local_12c0._24_4_ = fStack_1248 * 0.0;
                  local_12c0._28_4_ = 0;
                  local_12a0._4_4_ = (float)local_1260._4_4_ * auVar2._4_4_;
                  local_12a0._0_4_ = (float)local_1260._0_4_ * auVar2._0_4_;
                  local_12a0._8_4_ = fStack_1258 * auVar2._8_4_;
                  local_12a0._12_4_ = fStack_1254 * auVar2._12_4_;
                  local_12a0._16_4_ = fStack_1250 * 0.0;
                  local_12a0._20_4_ = fStack_124c * 0.0;
                  local_12a0._24_4_ = fStack_1248 * 0.0;
                  local_12a0._28_4_ = 0;
                  local_1280._4_4_ = (float)local_1260._4_4_ * fVar66;
                  local_1280._0_4_ = (float)local_1260._0_4_ * fVar80;
                  local_1280._8_4_ = fStack_1258 * fVar75;
                  local_1280._12_4_ = fStack_1254 * fVar76;
                  local_1280._16_4_ = fStack_1250 * 0.0;
                  local_1280._20_4_ = fStack_124c * 0.0;
                  local_1280._24_4_ = fStack_1248 * 0.0;
                  local_1280._28_4_ = 0;
                  auVar54._0_8_ = (ulong)CONCAT24(uVar7,(uint)uVar7) & 0x7fff00007fff;
                  auVar54._8_4_ = uVar40;
                  auVar54._12_4_ = uVar40;
                  auVar54._16_4_ = uVar40;
                  auVar54._20_4_ = uVar40;
                  auVar54._24_4_ = uVar40;
                  auVar54._28_4_ = uVar40;
                  auVar57 = vpaddd_avx2(auVar54,_DAT_0205d4c0);
                  auVar81._0_4_ = (float)(int)(*(ushort *)(lVar36 + 8 + lVar39) - 1);
                  auVar81._4_12_ = auVar113._4_12_;
                  auVar74._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                  auVar74._8_4_ = uVar42;
                  auVar74._12_4_ = uVar42;
                  auVar74._16_4_ = uVar42;
                  auVar74._20_4_ = uVar42;
                  auVar74._24_4_ = uVar42;
                  auVar74._28_4_ = uVar42;
                  auVar58 = vpaddd_avx2(auVar74,_DAT_0205d4e0);
                  auVar16 = vrcpss_avx(auVar81,auVar81);
                  auVar85._0_4_ = (float)(int)(*(ushort *)(lVar36 + 10 + lVar39) - 1);
                  auVar85._4_12_ = auVar113._4_12_;
                  auVar17 = vfnmadd213ss_fma(auVar81,auVar16,SUB6416(ZEXT464(0x40000000),0));
                  fStack_13c8 = auVar16._0_4_ * auVar17._0_4_;
                  auVar16 = vrcpss_avx(auVar85,auVar85);
                  auVar17 = vfnmadd213ss_fma(auVar85,auVar16,SUB6416(ZEXT464(0x40000000),0));
                  fVar80 = auVar16._0_4_ * auVar17._0_4_;
                  auVar57 = vcvtdq2ps_avx(auVar57);
                  fStack_13c4 = auVar57._28_4_ + auVar84._28_4_;
                  local_13e0 = (fVar78 * auVar57._0_4_ + auVar84._0_4_) * fStack_13c8;
                  fStack_13dc = (fVar79 * auVar57._4_4_ + auVar84._4_4_) * fStack_13c8;
                  fStack_13d8 = (fVar55 * auVar57._8_4_ + auVar84._8_4_) * fStack_13c8;
                  fStack_13d4 = (fVar62 * auVar57._12_4_ + auVar84._12_4_) * fStack_13c8;
                  fStack_13d0 = (fVar63 * auVar57._16_4_ + auVar84._16_4_) * fStack_13c8;
                  fStack_13cc = (fVar64 * auVar57._20_4_ + auVar84._20_4_) * fStack_13c8;
                  fStack_13c8 = (fVar65 * auVar57._24_4_ + auVar84._24_4_) * fStack_13c8;
                  auVar84 = vcvtdq2ps_avx(auVar58);
                  fVar66 = (fVar78 * auVar84._0_4_ + auVar68._0_4_) * fVar80;
                  fVar75 = (fVar79 * auVar84._4_4_ + auVar68._4_4_) * fVar80;
                  local_13c0._4_4_ = fVar75;
                  local_13c0._0_4_ = fVar66;
                  fVar76 = (fVar55 * auVar84._8_4_ + auVar68._8_4_) * fVar80;
                  local_13c0._8_4_ = fVar76;
                  fVar77 = (fVar62 * auVar84._12_4_ + auVar68._12_4_) * fVar80;
                  local_13c0._12_4_ = fVar77;
                  fVar78 = (fVar63 * auVar84._16_4_ + auVar68._16_4_) * fVar80;
                  local_13c0._16_4_ = fVar78;
                  fVar79 = (fVar64 * auVar84._20_4_ + auVar68._20_4_) * fVar80;
                  local_13c0._20_4_ = fVar79;
                  fVar80 = (fVar65 * auVar84._24_4_ + auVar68._24_4_) * fVar80;
                  local_13c0._24_4_ = fVar80;
                  local_13c0._28_4_ = auVar84._28_4_ + auVar68._28_4_;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0067f1a9:
                      auVar90 = ZEXT3264(local_14a0);
                      auVar91 = ZEXT3264(local_14c0);
                      auVar100 = ZEXT3264(local_14e0);
                      auVar103 = ZEXT3264(local_1500);
                      auVar106 = ZEXT3264(local_1520);
                      auVar109 = ZEXT3264(local_1540);
                      auVar112 = ZEXT3264(local_1560);
                      goto LAB_0067f139;
                    }
                    auVar84 = vrcpps_avx(local_1380);
                    auVar83._8_4_ = 0x3f800000;
                    auVar83._0_8_ = &DAT_3f8000003f800000;
                    auVar83._12_4_ = 0x3f800000;
                    auVar83._16_4_ = 0x3f800000;
                    auVar83._20_4_ = 0x3f800000;
                    auVar83._24_4_ = 0x3f800000;
                    auVar83._28_4_ = 0x3f800000;
                    auVar16 = vfnmadd213ps_fma(local_1380,auVar84,auVar83);
                    auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar84,auVar84);
                    fVar55 = auVar16._0_4_;
                    fVar62 = auVar16._4_4_;
                    fVar63 = auVar16._8_4_;
                    fVar64 = auVar16._12_4_;
                    local_12e0[0] = fVar55 * local_13a0._0_4_;
                    local_12e0[1] = fVar62 * local_13a0._4_4_;
                    local_12e0[2] = fVar63 * local_13a0._8_4_;
                    local_12e0[3] = fVar64 * local_13a0._12_4_;
                    fStack_12d0 = fVar95 * 0.0;
                    fStack_12cc = fVar96 * 0.0;
                    fStack_12c8 = fVar97 * 0.0;
                    uStack_12c4 = auVar84._28_4_;
                    local_1320[0] = local_13e0 * fVar55;
                    local_1320[1] = fStack_13dc * fVar62;
                    local_1320[2] = fStack_13d8 * fVar63;
                    local_1320[3] = fStack_13d4 * fVar64;
                    fStack_1310 = fStack_13d0 * 0.0;
                    fStack_130c = fStack_13cc * 0.0;
                    fStack_1308 = fStack_13c8 * 0.0;
                    fStack_1304 = fStack_13c4;
                    local_1300[0] = fVar66 * fVar55;
                    local_1300[1] = fVar75 * fVar62;
                    local_1300[2] = fVar76 * fVar63;
                    local_1300[3] = fVar77 * fVar64;
                    fStack_12f0 = fVar78 * 0.0;
                    fStack_12ec = fVar79 * 0.0;
                    fStack_12e8 = fVar80 * 0.0;
                    fStack_12e4 = fStack_13c4;
                    uVar33 = vmovmskps_avx(local_1340);
                    bVar51 = uVar33 == 0;
                    if (!bVar51) {
                      uVar41 = 0;
                      uVar44 = (ulong)(uVar33 & 0xff);
                      for (uVar43 = uVar44; (uVar43 & 1) == 0;
                          uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        uVar41 = uVar41 + 1;
                      }
                      local_1690 = CONCAT44(uVar9,uVar9);
                      local_1590 = *local_1660;
                      uStack_1588 = local_1660[1];
                      local_1580 = auVar113._0_32_;
                      do {
                        uVar31 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_1440 = local_1320[uVar41];
                        fVar80 = local_1300[uVar41];
                        local_1430._4_4_ = fVar80;
                        local_1430._0_4_ = fVar80;
                        local_1430._8_4_ = fVar80;
                        local_1430._12_4_ = fVar80;
                        *(float *)(ray + k * 4 + 0x80) = local_12e0[uVar41];
                        local_15c0.context = context->user;
                        local_1470 = *(undefined4 *)(local_12c0 + uVar41 * 4);
                        local_1460 = *(undefined4 *)(local_12a0 + uVar41 * 4);
                        local_1450 = *(undefined4 *)(local_1280 + uVar41 * 4);
                        uStack_1418 = CONCAT44(uVar9,uVar9);
                        local_1420 = local_1690;
                        local_1410._4_4_ = uVar32;
                        local_1410._0_4_ = uVar32;
                        local_1410._8_4_ = uVar32;
                        local_1410._12_4_ = uVar32;
                        vpcmpeqd_avx2(ZEXT1632(local_1410),ZEXT1632(local_1410));
                        uStack_13fc = (local_15c0.context)->instID[0];
                        local_1400 = uStack_13fc;
                        uStack_13f8 = uStack_13fc;
                        uStack_13f4 = uStack_13fc;
                        uStack_13f0 = (local_15c0.context)->instPrimID[0];
                        uStack_13ec = uStack_13f0;
                        uStack_13e8 = uStack_13f0;
                        uStack_13e4 = uStack_13f0;
                        local_1670 = local_1590;
                        uStack_1668 = uStack_1588;
                        local_15c0.valid = (int *)&local_1670;
                        local_15c0.geometryUserPtr = pGVar10->userPtr;
                        local_15c0.hit = (RTCHitN *)&local_1470;
                        local_15c0.N = 4;
                        local_15c0.ray = (RTCRayN *)ray;
                        uStack_146c = local_1470;
                        uStack_1468 = local_1470;
                        uStack_1464 = local_1470;
                        uStack_145c = local_1460;
                        uStack_1458 = local_1460;
                        uStack_1454 = local_1460;
                        uStack_144c = local_1450;
                        uStack_1448 = local_1450;
                        uStack_1444 = local_1450;
                        fStack_143c = local_1440;
                        fStack_1438 = local_1440;
                        fStack_1434 = local_1440;
                        if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar10->occlusionFilterN)(&local_15c0);
                        }
                        auVar13._8_8_ = uStack_1668;
                        auVar13._0_8_ = local_1670;
                        if (auVar13 == (undefined1  [16])0x0) {
                          auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar16 = auVar16 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_15c0);
                          }
                          auVar14._8_8_ = uStack_1668;
                          auVar14._0_8_ = local_1670;
                          auVar17 = vpcmpeqd_avx((undefined1  [16])0x0,auVar14);
                          auVar16 = auVar17 ^ _DAT_01febe20;
                          auVar67._8_4_ = 0xff800000;
                          auVar67._0_8_ = 0xff800000ff800000;
                          auVar67._12_4_ = 0xff800000;
                          auVar17 = vblendvps_avx(auVar67,*(undefined1 (*) [16])
                                                           (local_15c0.ray + 0x80),auVar17);
                          *(undefined1 (*) [16])(local_15c0.ray + 0x80) = auVar17;
                        }
                        auVar56._8_8_ = 0x100000001;
                        auVar56._0_8_ = 0x100000001;
                        if ((auVar56 & auVar16) != (undefined1  [16])0x0) {
                          auVar113 = ZEXT3264(local_1580);
                          if (!bVar51) goto LAB_0067f1a9;
                          break;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar31;
                        uVar43 = uVar41 & 0x3f;
                        uVar41 = 0;
                        uVar44 = uVar44 ^ 1L << uVar43;
                        for (uVar43 = uVar44; (uVar43 & 1) == 0;
                            uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                          uVar41 = uVar41 + 1;
                        }
                        bVar51 = uVar44 == 0;
                        auVar113 = ZEXT3264(local_1580);
                      } while (!bVar51);
                    }
                  }
                }
              }
              uVar37 = uVar37 - 1 & uVar37;
            } while (uVar37 != 0);
          }
          local_15d0 = local_15d0 + 1;
          bVar50 = local_15d0 < local_15d8;
          auVar90 = ZEXT3264(local_14a0);
          auVar91 = ZEXT3264(local_14c0);
          auVar100 = ZEXT3264(local_14e0);
          auVar103 = ZEXT3264(local_1500);
          auVar106 = ZEXT3264(local_1520);
          auVar109 = ZEXT3264(local_1540);
          auVar112 = ZEXT3264(local_1560);
        } while (local_15d0 != local_15d8);
      }
LAB_0067f139:
      uVar32 = 0;
      uVar37 = local_1658;
      uVar41 = local_1630;
      uVar43 = local_1638;
      uVar44 = local_1640;
      uVar45 = local_1648;
      uVar46 = local_1650;
      if (bVar50) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar32 = 1;
      }
    }
    puVar38 = local_1618;
    unaff_R12 = local_1628;
  } while ((uVar32 & 3) == 0);
  return local_1620 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }